

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::LocationValidator::validateBuiltinVariable
          (LocationValidator *this,string *resource,GLint propValue,string *implementationName)

{
  TestLog *pTVar1;
  MessageBuilder *pMVar2;
  allocator<char> local_359;
  string local_358;
  MessageBuilder local_338;
  MessageBuilder local_1a8;
  string *local_28;
  string *implementationName_local;
  string *psStack_18;
  GLint propValue_local;
  string *resource_local;
  LocationValidator *this_local;
  
  local_28 = implementationName;
  implementationName_local._4_4_ = propValue;
  psStack_18 = resource;
  resource_local = (string *)this;
  pTVar1 = tcu::TestContext::getLog
                     ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
  tcu::TestLog::operator<<(&local_1a8,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_1a8,(char (*) [33])"Verifying location, expecting -1");
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  if (implementationName_local._4_4_ != -1) {
    pTVar1 = tcu::TestContext::getLog
                       ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
    tcu::TestLog::operator<<(&local_338,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_338,(char (*) [13])"\tError, got ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(int *)((long)&implementationName_local + 4));
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_338);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,"resource location invalid",&local_359);
    PropValidator::setError((PropValidator *)this,&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator(&local_359);
  }
  return;
}

Assistant:

void LocationValidator::validateBuiltinVariable (const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	DE_UNREF(resource);
	DE_UNREF(implementationName);

	// built-ins have no location

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying location, expecting -1" << tcu::TestLog::EndMessage;

	if (propValue != -1)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
		setError("resource location invalid");
	}
}